

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<std::optional<solitaire::cards::Value>_()> * __thiscall
testing::internal::TypedExpectation<std::optional<solitaire::cards::Value>_()>::Times
          (TypedExpectation<std::optional<solitaire::cards::Value>_()> *this,int n)

{
  TypedExpectation<std::optional<solitaire::cards::Value>_()> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<std::optional<solitaire::cards::Value>_()> *pTStack_10;
  int n_local;
  TypedExpectation<std::optional<solitaire::cards::Value>_()> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }